

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall cereal::JSONInputArchive::search(JSONInputArchive *this)

{
  char *__s1;
  int iVar1;
  char *__s2;
  
  __s1 = this->itsNextName;
  this->itsNextName = (char *)0x0;
  if (__s1 == (char *)0x0) {
    return;
  }
  __s2 = Iterator::name((this->itsIteratorStack).
                        super__Vector_base<cereal::JSONInputArchive::Iterator,_std::allocator<cereal::JSONInputArchive::Iterator>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1);
  if ((__s2 != (char *)0x0) && (iVar1 = strcmp(__s1,__s2), iVar1 == 0)) {
    return;
  }
  Iterator::search((this->itsIteratorStack).
                   super__Vector_base<cereal::JSONInputArchive::Iterator,_std::allocator<cereal::JSONInputArchive::Iterator>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1,__s1);
  return;
}

Assistant:

inline void search()
      {
        // store pointer to itsNextName locally and reset to nullptr in case search() throws
        auto localNextName = itsNextName;
        itsNextName = nullptr;

        // The name an NVP provided with setNextName()
        if( localNextName )
        {
          // The actual name of the current node
          auto const actualName = itsIteratorStack.back().name();

          // Do a search if we don't see a name coming up, or if the names don't match
          if( !actualName || std::strcmp( localNextName, actualName ) != 0 )
            itsIteratorStack.back().search( localNextName );
        }
      }